

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

bool tchecker::ta::has_non_constant_reset(system_t *system)

{
  bool bVar1;
  has_clock_resets_t hVar2;
  edge_id_t id;
  edges_collection_const_iterator_t *peVar3;
  element_type *this;
  typed_statement_t *stmt;
  undefined1 local_58 [5];
  has_clock_resets_t statement_has_clock_resets;
  edge_const_shared_ptr_t *edge;
  edges_collection_const_iterator_t __end2;
  edges_collection_const_iterator_t __begin2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range2;
  system_t *system_local;
  
  ___begin2 = tchecker::system::edges_t::edges
                        (&(system->super_system_t).super_system_t.super_edges_t);
  peVar3 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                    *)&__begin2);
  __end2.super_const_iterator._M_current = (const_iterator)(peVar3->super_const_iterator)._M_current
  ;
  peVar3 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *)&__begin2);
  edge = (edge_const_shared_ptr_t *)(peVar3->super_const_iterator)._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2.super_const_iterator,
                            (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                             *)&edge), bVar1) {
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)local_58);
    this = std::
           __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    id = tchecker::system::edge_t::id(this);
    stmt = system_t::statement(system,id);
    hVar2 = has_clock_resets(stmt);
    if ((((uint3)hVar2 & 0x100) == 0) && (((uint3)hVar2 & 0x10000) == 0)) {
      bVar1 = false;
    }
    else {
      system_local._7_1_ = 1;
      bVar1 = true;
    }
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_58);
    if (bVar1) goto LAB_00213f37;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2.super_const_iterator);
  }
  system_local._7_1_ = 0;
LAB_00213f37:
  return (bool)(system_local._7_1_ & 1);
}

Assistant:

bool has_non_constant_reset(tchecker::ta::system_t const & system)
{
  // Check edge statements
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_resets_t statement_has_clock_resets = tchecker::has_clock_resets(system.statement(edge->id()));
    if (statement_has_clock_resets.clock || statement_has_clock_resets.sum)
      return true;
  }
  return false;
}